

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_JsonEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  int iVar9;
  char *pcVar10;
  TemplateString local_238;
  char *local_218;
  char *expected;
  TemplateString local_1f0;
  TemplateString local_1d0;
  TemplateDictionaryPeer local_1b0;
  TemplateDictionaryPeer peer;
  size_t sStack_1a0;
  undefined8 local_198;
  TemplateId TStack_190;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_98,"TestJsonEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(local_78,&local_98,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_b8,"easy JSON");
  ctemplate::TemplateString::TemplateString(&local_e8,"joo");
  TVar1.length_ = local_b8.length_;
  TVar1.ptr_ = local_b8.ptr_;
  TVar1.is_immutable_ = local_b8.is_immutable_;
  TVar1._17_7_ = local_b8._17_7_;
  TVar1.id_ = local_b8.id_;
  TVar5.length_ = local_e8.length_;
  TVar5.ptr_ = local_e8.ptr_;
  TVar5.is_immutable_ = local_e8.is_immutable_;
  TVar5._17_7_ = local_e8._17_7_;
  TVar5.id_ = local_e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar5,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_108,"harder JSON");
  ctemplate::TemplateString::TemplateString(&local_128,"f = \"joo\"; e = \'joo\';");
  TVar2.length_ = local_108.length_;
  TVar2.ptr_ = local_108.ptr_;
  TVar2.is_immutable_ = local_108.is_immutable_;
  TVar2._17_7_ = local_108._17_7_;
  TVar2.id_ = local_108.id_;
  TVar6.length_ = local_128.length_;
  TVar6.ptr_ = local_128.ptr_;
  TVar6.is_immutable_ = local_128.is_immutable_;
  TVar6._17_7_ = local_128._17_7_;
  TVar6.id_ = local_128.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar6,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_148,"hardest JSON");
  ctemplate::TemplateString::TemplateString
            (&local_168,"f = \'foo<>\';\r\n\t\fprint \"\\&foo = /\b\", \"foo\"");
  TVar3.length_ = local_148.length_;
  TVar3.ptr_ = local_148.ptr_;
  TVar3.is_immutable_ = local_148.is_immutable_;
  TVar3._17_7_ = local_148._17_7_;
  TVar3.id_ = local_148.id_;
  TVar7.length_ = local_168.length_;
  TVar7.ptr_ = local_168.ptr_;
  TVar7.is_immutable_ = local_168.is_immutable_;
  TVar7._17_7_ = local_168._17_7_;
  TVar7.id_ = local_168.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar7,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_188,"html in JSON");
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"<html>&nbsp;</html>");
  TVar4.length_ = local_188.length_;
  TVar4.ptr_ = local_188.ptr_;
  TVar4.is_immutable_ = local_188.is_immutable_;
  TVar4._17_7_ = local_188._17_7_;
  TVar4.id_ = local_188.id_;
  TVar8.length_ = sStack_1a0;
  TVar8.ptr_ = (char *)peer.dict_;
  TVar8._16_8_ = local_198;
  TVar8.id_ = TStack_190;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar8,(TemplateModifier *)local_78);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_1b0,local_78);
  ctemplate::TemplateString::TemplateString(&local_1d0,"easy JSON");
  pcVar10 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_1b0,&local_1d0);
  iVar9 = strcmp(pcVar10,"joo");
  if (iVar9 != 0) {
    fprintf(_stderr,"Check failed: %s\n","strcmp(peer.GetSectionValue(\"easy JSON\"), \"joo\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_1f0,"harder JSON");
  pcVar10 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_1b0,&local_1f0);
  iVar9 = strcmp(pcVar10,"f = \\\"joo\\\"; e = \'joo\';");
  if (iVar9 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"harder JSON\"), \"f = \\\\\\\"joo\\\\\\\"; \" \"e = \'joo\';\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)&expected,"html in JSON");
  pcVar10 = ctemplate::TemplateDictionaryPeer::GetSectionValue
                      (&local_1b0,(TemplateString *)&expected);
  iVar9 = strcmp(pcVar10,"\\u003Chtml\\u003E\\u0026nbsp;\\u003C\\/html\\u003E");
  if (iVar9 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"html in JSON\"), \"\\\\u003Chtml\\\\u003E\\\\u0026nbsp;\\\\u003C\\\\/html\\\\u003E\") == 0"
           );
    exit(1);
  }
  local_218 = 
  "f = \'foo\\u003C\\u003E\';\\r\\n\\t\\fprint \\\"\\\\\\u0026foo = \\/\\b\\\", \\\"foo\\\"";
  ctemplate::TemplateString::TemplateString(&local_238,"hardest JSON");
  pcVar10 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_1b0,&local_238);
  iVar9 = strcmp(pcVar10,local_218);
  if (iVar9 == 0) {
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n",
          "strcmp(peer.GetSectionValue(\"hardest JSON\"), expected) == 0");
  exit(1);
}

Assistant:

TEST(TemplateModifiers, JsonEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestJsonEscape", NULL);
  dict.SetEscapedValue("easy JSON", "joo",
                       GOOGLE_NAMESPACE::json_escape);
  dict.SetEscapedValue("harder JSON", "f = \"joo\"; e = 'joo';",
                       GOOGLE_NAMESPACE::json_escape);
  dict.SetEscapedValue("hardest JSON",
                       "f = 'foo<>';\r\n\t\fprint \"\\&foo = /\b\", \"foo\"",
                       GOOGLE_NAMESPACE::json_escape);
  dict.SetEscapedValue("html in JSON", "<html>&nbsp;</html>",
                       GOOGLE_NAMESPACE::json_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy JSON"), "joo");
  EXPECT_STREQ(peer.GetSectionValue("harder JSON"), "f = \\\"joo\\\"; "
               "e = 'joo';");
  EXPECT_STREQ(peer.GetSectionValue("html in JSON"),
               "\\u003Chtml\\u003E\\u0026nbsp;\\u003C\\/html\\u003E");
  // There's a bug in MSVC 7.1 where you can't pass a literal string
  // with more than one \" in it to a macro (!) -- see
  //    http://marc.info/?t=110853662500001&r=1&w=2
  // We work around this by assigning the string to a variable first.
  const char* expected = ("f = 'foo\\u003C\\u003E';\\r\\n\\t\\fprint \\\""
                          "\\\\\\u0026foo = \\/\\b\\\", \\\"foo\\\"");
  EXPECT_STREQ(peer.GetSectionValue("hardest JSON"), expected);
}